

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

QPDFEFStreamObjectHelper *
QPDFEFStreamObjectHelper::newFromStream
          (QPDFEFStreamObjectHelper *__return_storage_ptr__,QPDFObjectHandle *stream)

{
  bool bVar1;
  longlong in_stack_fffffffffffffea8;
  string local_150;
  string local_130;
  undefined1 local_110 [16];
  string local_100;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e0;
  Pl_Discard discard;
  Pl_Count count;
  Pl_MD5 md5;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)stream);
  QPDFEFStreamObjectHelper(__return_storage_ptr__,(QPDFObjectHandle *)&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)&discard);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&md5,"/Type",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&count,"/EmbeddedFile",(allocator<char> *)(local_110 + 0x10));
  QPDFObjectHandle::newName(&local_150);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)&discard,(string *)&md5,(QPDFObjectHandle *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_150._M_string_length);
  std::__cxx11::string::~string((string *)&count);
  std::__cxx11::string::~string((string *)&md5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&discard.super_Pipeline.identifier);
  Pl_Discard::Pl_Discard(&discard);
  Pl_MD5::Pl_MD5(&md5,"EF md5",&discard.super_Pipeline);
  Pl_Count::Pl_Count(&count,"EF size",&md5.super_Pipeline);
  bVar1 = QPDFObjectHandle::pipeStreamData
                    (stream,&count.super_Pipeline,(bool *)0x0,0,qpdf_dl_all,false,false);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"/Size",(allocator<char> *)(local_110 + 0x10));
    Pl_Count::getCount(&count);
    QPDFObjectHandle::newInteger(in_stack_fffffffffffffea8);
    setParam(__return_storage_ptr__,&local_150,(QPDFObjectHandle *)&local_130);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"/CheckSum",(allocator<char> *)&stack0xfffffffffffffeaf);
    Pl_MD5::getHexDigest_abi_cxx11_((string *)(local_110 + 0x10),&md5);
    QUtil::hex_decode(&local_130,(string *)(local_110 + 0x10));
    QPDFObjectHandle::newString((string *)local_110);
    setParam(__return_storage_ptr__,&local_150,(QPDFObjectHandle *)local_110);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)(local_110 + 0x10));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"unable to get stream data for new embedded file stream",
               (allocator<char> *)&local_130);
    QPDFObjectHandle::warnIfPossible(stream,&local_150);
  }
  std::__cxx11::string::~string((string *)&local_150);
  Pl_Count::~Pl_Count(&count);
  Pl_MD5::~Pl_MD5(&md5);
  Pl_Discard::~Pl_Discard(&discard);
  return __return_storage_ptr__;
}

Assistant:

QPDFEFStreamObjectHelper
QPDFEFStreamObjectHelper::newFromStream(QPDFObjectHandle stream)
{
    QPDFEFStreamObjectHelper result(stream);
    stream.getDict().replaceKey("/Type", QPDFObjectHandle::newName("/EmbeddedFile"));
    Pl_Discard discard;
    // The PDF spec specifies use of MD5 here and notes that it is not to be used for security. MD5
    // is known to be insecure.
    Pl_MD5 md5("EF md5", &discard);
    Pl_Count count("EF size", &md5);
    if (!stream.pipeStreamData(&count, nullptr, 0, qpdf_dl_all)) {
        stream.warnIfPossible("unable to get stream data for new embedded file stream");
    } else {
        result.setParam("/Size", QPDFObjectHandle::newInteger(count.getCount()));
        result.setParam(
            "/CheckSum", QPDFObjectHandle::newString(QUtil::hex_decode(md5.getHexDigest())));
    }
    return result;
}